

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O3

bool __thiscall
icu_63::number::impl::ConstantAffixModifier::semanticallyEquivalent
          (ConstantAffixModifier *this,Modifier *other)

{
  ushort uVar1;
  short sVar2;
  UBool UVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  
  lVar4 = __dynamic_cast(other,&Modifier::typeinfo,&typeinfo,0);
  if (lVar4 != 0) {
    uVar1 = (this->fPrefix).fUnion.fStackFields.fLengthAndFlags;
    if ((uVar1 & 1) == 0) {
      if ((short)uVar1 < 0) {
        iVar6 = (this->fPrefix).fUnion.fFields.fLength;
      }
      else {
        iVar6 = (int)(short)uVar1 >> 5;
      }
      sVar2 = *(short *)(lVar4 + 0x18);
      if (sVar2 < 0) {
        iVar5 = *(int *)(lVar4 + 0x1c);
      }
      else {
        iVar5 = (int)sVar2 >> 5;
      }
      if (((int)sVar2 & 1U) != 0) {
        return false;
      }
      if (iVar6 != iVar5) {
        return false;
      }
      UVar3 = icu_63::UnicodeString::doEquals(&this->fPrefix,(UnicodeString *)(lVar4 + 0x10),iVar6);
      bVar7 = UVar3 != '\0';
    }
    else {
      bVar7 = (bool)(*(byte *)(lVar4 + 0x18) & 1);
    }
    if (bVar7 != false) {
      uVar1 = (this->fSuffix).fUnion.fStackFields.fLengthAndFlags;
      if ((uVar1 & 1) == 0) {
        if ((short)uVar1 < 0) {
          iVar6 = (this->fSuffix).fUnion.fFields.fLength;
        }
        else {
          iVar6 = (int)(short)uVar1 >> 5;
        }
        sVar2 = *(short *)(lVar4 + 0x58);
        if (sVar2 < 0) {
          iVar5 = *(int *)(lVar4 + 0x5c);
        }
        else {
          iVar5 = (int)sVar2 >> 5;
        }
        if (((int)sVar2 & 1U) != 0) {
          return false;
        }
        if (iVar6 != iVar5) {
          return false;
        }
        UVar3 = icu_63::UnicodeString::doEquals
                          (&this->fSuffix,(UnicodeString *)(lVar4 + 0x50),iVar6);
        bVar7 = UVar3 != '\0';
      }
      else {
        bVar7 = (bool)(*(byte *)(lVar4 + 0x58) & 1);
      }
      if ((bVar7 != false) && (this->fField == *(Field *)(lVar4 + 0x90))) {
        return this->fStrong == (bool)*(char *)(lVar4 + 0x94);
      }
    }
  }
  return false;
}

Assistant:

bool ConstantAffixModifier::semanticallyEquivalent(const Modifier& other) const {
    auto* _other = dynamic_cast<const ConstantAffixModifier*>(&other);
    if (_other == nullptr) {
        return false;
    }
    return fPrefix == _other->fPrefix
        && fSuffix == _other->fSuffix
        && fField == _other->fField
        && fStrong == _other->fStrong;
}